

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void CVmPack::pack_group(CVmPackPos *p,CVmPackArgs *args_main,CVmPackGroup *group,int list_per_iter)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar5;
  CVmPackType *pCVar6;
  CVmPackType *t_00;
  CVmPackArgs *args;
  ListArgs listargs;
  vm_val_t listval;
  CVmPackType t2;
  CVmPackType t;
  CVmPackArgs local_108;
  undefined8 local_100;
  undefined8 local_f8;
  anon_union_8_8_cb74652f_for_val aStack_f0;
  undefined4 local_e8;
  int local_e4;
  undefined1 local_e0 [16];
  CVmPackType local_d0;
  CVmPackType local_80;
  vm_val_t *pvVar4;
  
  iVar1 = (*args_main->_vptr_CVmPackArgs[2])(args_main,local_e0);
  pvVar4 = (vm_val_t *)CONCAT44(extraout_var,iVar1);
  local_108._vptr_CVmPackArgs = (_func_int **)&PTR_more_00367dd0;
  local_100 = 0;
  local_f8 = *(undefined8 *)pvVar4;
  aStack_f0 = pvVar4->val;
  local_e8 = 1;
  local_e4 = vm_val_t::ll_length(pvVar4);
  iVar1 = (**args_main->_vptr_CVmPackArgs)(args_main);
  args = args_main;
  if (list_per_iter != 0) {
    iVar1 = (**args_main->_vptr_CVmPackArgs)(args_main);
    (*args_main->_vptr_CVmPackArgs[3])(args_main);
    args = &local_108;
  }
  if (group->num_iters == -2) {
    if (iVar1 != 0) {
LAB_002a8270:
      CVmPackPos::getch(p);
      if (p->len == 0) {
        return;
      }
      do {
        wVar2 = CVmPackPos::getch(p);
        if ((wVar2 == L'[') || (wVar2 == L'(')) {
          pCVar6 = (CVmPackType *)0x0;
LAB_002a82a8:
          pack_subgroup(p,args,group,pCVar6);
        }
        else {
          if (wVar2 == group->close_paren) {
            iVar1 = (**args->_vptr_CVmPackArgs)(args);
            if (list_per_iter != 0) {
              iVar1 = (**args_main->_vptr_CVmPackArgs)(args_main);
              iVar3 = (*args_main->_vptr_CVmPackArgs[2])(args_main,local_e0);
              pvVar4 = (vm_val_t *)CONCAT44(extraout_var_00,iVar3);
              local_100 = 0;
              local_f8 = *(undefined8 *)pvVar4;
              aStack_f0 = pvVar4->val;
              local_e8 = 1;
              local_e4 = vm_val_t::ll_length(pvVar4);
              (*args_main->_vptr_CVmPackArgs[3])(args_main);
            }
            if (group->num_iters == -2) {
              if (iVar1 != 0) {
                iVar3 = group->cur_iter;
LAB_002a8402:
                group->cur_iter = iVar3 + 1;
                iVar1 = (*group->ds->_vptr_CVmDataSource[7])();
                group->stream_ofs = CONCAT44(extraout_var_01,iVar1);
                (p->p).p_ = (group->start).p.p_;
                p->len = (group->start).len;
                p->idx = (group->start).idx;
                goto LAB_002a82ad;
              }
              iVar5 = group->up_to_iters;
            }
            else {
              iVar3 = group->cur_iter;
              iVar5 = group->up_to_iters;
              if (iVar3 < group->num_iters) {
                if (iVar1 == 0 && iVar5 != 0) goto LAB_002a8491;
                goto LAB_002a8402;
              }
            }
            if (iVar5 == 0) {
              return;
            }
LAB_002a8491:
            if (list_per_iter != 0) {
              while (iVar1 = (**args_main->_vptr_CVmPackArgs)(args_main), iVar1 != 0) {
                (*args_main->_vptr_CVmPackArgs[3])(args_main);
              }
              return;
            }
            while (iVar1 = (**args->_vptr_CVmPackArgs)(args), iVar1 != 0) {
              (*args->_vptr_CVmPackArgs[3])(args);
            }
            return;
          }
          local_80.lit.idx = 0;
          local_80.lit.p.p_ = (char *)0x0;
          local_80.lit.len = 0;
          local_80.type_code = L'\0';
          local_80.big_endian = 0;
          local_80.count = -1;
          local_80.fmtidx = 0;
          local_80.tilde = 0;
          local_80.pct = 0;
          local_80.qu = 0;
          local_80.null_term = 0;
          local_80.count_in_bytes = 0;
          local_80.count_as_type = L'\0';
          local_80.up_to_count = 0;
          local_80.bang = 0;
          parse_type(p,&local_80,group);
          wVar2 = CVmPackPos::getch(p);
          if (wVar2 == L'/') {
            CVmPackPos::inc(p);
            wVar2 = CVmPackPos::getch(p);
            pCVar6 = &local_80;
            if ((wVar2 == L'[') || (wVar2 == L'(')) goto LAB_002a82a8;
            local_d0.lit.idx = 0;
            local_d0.lit.p.p_ = (char *)0x0;
            local_d0.lit.len = 0;
            local_d0.type_code = L'\0';
            local_d0.big_endian = 0;
            local_d0.count = -1;
            local_d0.fmtidx = 0;
            local_d0.tilde = 0;
            local_d0.pct = 0;
            local_d0.qu = 0;
            local_d0.null_term = 0;
            local_d0.count_in_bytes = 0;
            local_d0.count_as_type = L'\0';
            local_d0.up_to_count = 0;
            local_d0.bang = 0;
            parse_type(p,&local_d0,group);
            t_00 = &local_d0;
          }
          else {
            pCVar6 = (CVmPackType *)0x0;
            t_00 = &local_80;
          }
          pack_item(group,args,t_00,pCVar6);
        }
LAB_002a82ad:
        CVmPackPos::getch(p);
        if (p->len == 0) {
          return;
        }
      } while( true );
    }
  }
  else if ((iVar1 != 0) || (group->up_to_iters == 0)) goto LAB_002a8270;
  (p->p).p_ = (group->start).p.p_;
  p->len = (group->start).len;
  p->idx = (group->start).idx;
  skip_group(p,group->close_paren);
  return;
}

Assistant:

void CVmPack::pack_group(VMG_ CVmPackPos *p, CVmPackArgs *args_main,
                         CVmPackGroup *group, int list_per_iter)
{
    /* assume we're unpacking from the main argument list */
    CVmPackArgs *args = args_main;
    
    /* 
     *   if there's a list per group iteration, the next argument should be a
     *   list from which we'll take arguments for this single iteration 
     */
    vm_val_t listval;
    ListArgs listargs(vmg_ args->get(&listval));
    int more = args->more();
    if (list_per_iter)
    {
        /* pull out and switch to the sublist for the first iteration */
        more = args_main->more();
        args = &listargs;
        args_main->next();
    }

    /* 
     *   if this is an up-to count, and the source list is empty, packing
     *   zero iterations is valid 
     */
    if ((group->num_iters == ITER_STAR || group->up_to_iters) && !more)
    {
        /* skip the group in the source */
        p->set(&group->start);
        skip_group(p, group->close_paren);

        /* we're done */
        return;
    }

    /* run through the format list */
    while (p->more())
    {
        /* check for group entry/exit */
        wchar_t c = p->getch();
        if (c == '(' || c == '[')
        {
            /* start of a group - pack the sub-group */
            pack_subgroup(vmg_ p, args, group, 0);
        }
        else if (c == group->close_paren)
        {
            /* 
             *   if we're reading arguments from a separate sublist per
             *   iteration of the group, move on to the next sublist 
             */
            int more = args->more();
            if (list_per_iter)
            {
                /* switch to the next sublist from the main arguments */
                more = args_main->more();
                listargs.set(vmg_ args_main->get(&listval));
                args_main->next();
            }

            /* 
             *   Determine if we're done.  If the group has a '*' repeat
             *   count, we're done when we're out of arguments.  If it has an
             *   up-to count, we're done if we're either out of arguments or
             *   at the iteration count limit.  Otherwise, we're done when
             *   we've reached the iteration count limit.
             */
            if ((group->num_iters == ITER_STAR
                 ? !more
                 : group->cur_iter >= group->num_iters)
                || (group->up_to_iters && !more))
            {
                /* 
                 *   if this is an up-to count, make sure we consumed all
                 *   arguments 
                 */
                if (group->up_to_iters)
                {
                    if (list_per_iter)
                        for ( ; args_main->more() ; args_main->next()) ;
                    else
                        for ( ; args->more() ; args->next()) ;
                }
                
                /* done */
                return;
            }

            /* 
             *   We're going back for another iteration of the group.
             *   Increment the iteration count, and go back to the start of
             *   the group in the template string.  
             */
            group->cur_iter++;
            group->stream_ofs = group->ds->get_pos();
            p->set(&group->start);
        }
        else
        {
            /* 
             *   It's not a group, so it must be a single item.  Parse the
             *   item definition. 
             */
            CVmPackType t;
            parse_type(p, &t, group);

            /* check to see if this is a length prefix to the next item */
            if (p->getch() == '/')
            {
                /* skip the '/' */
                p->inc();

                /* check for a group */
                if ((c = p->getch()) == '(' || c == '[')
                {
                    /* go pack the subgroup with the prefix count */
                    pack_subgroup(vmg_ p, args, group, &t);
                }
                else
                {
                    /* 
                     *   It's not a group, so it must be a single item.
                     *   Parse the item definition. 
                     */
                    CVmPackType t2;
                    parse_type(p, &t2, group);

                    /* pack the item with the count prefix */
                    pack_item(vmg_ group, args, &t2, &t);
                }
            }
            else
            {
                /* there's no count prefix - go pack the single item */
                pack_item(vmg_ group, args, &t, 0);
            }
        }
    }
}